

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void TCLAP::ExtractValue<double>(double *destVal,string *strVal,ValueLike *vl)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *__rhs;
  string *in_RSI;
  double *in_RDI;
  int valuesRead;
  istringstream is;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  allocator<char> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  ArgParseException *in_stack_fffffffffffffe10;
  int local_19c;
  istringstream local_198 [400];
  double *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::istringstream::istringstream(local_198,in_RSI,_S_in);
  local_19c = 0;
  while ((bVar1 = std::ios::good(), (bVar1 & 1) != 0 && (iVar2 = std::istream::peek(), iVar2 != -1))
        ) {
    std::istream::operator>>((istream *)local_198,local_8);
    local_19c = local_19c + 1;
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    if (local_19c < 2) {
      std::__cxx11::istringstream::~istringstream(local_198);
      return;
    }
    __rhs = (char *)__cxa_allocate_exception(0x68);
    std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::operator+(in_stack_fffffffffffffd68,__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    ArgParseException::ArgParseException
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    __cxa_throw(__rhs,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
  }
  uVar3 = __cxa_allocate_exception(0x68);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  ArgParseException::ArgParseException
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  __cxa_throw(uVar3,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    std::istringstream is(strVal);

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}